

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  pointer pbVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  TargetType targetType;
  int iVar6;
  cmGeneratorTarget *pcVar7;
  ulong uVar8;
  cmLocalNinjaGenerator *pcVar9;
  undefined4 extraout_var;
  char *pcVar10;
  cmMakefile *this_00;
  string *psVar11;
  ostream *poVar12;
  cmGlobalNinjaGenerator *pcVar13;
  reference pvVar14;
  reference pbVar15;
  cmRulePlaceholderExpander *pcVar16;
  cmOutputConverter *local_1c30;
  cmOutputConverter *local_1a00;
  char *local_18f8;
  bool local_189a;
  allocator local_1881;
  string local_1880;
  string local_1860;
  string local_1840;
  string local_1820;
  undefined1 local_1800 [8];
  ostringstream description;
  undefined1 local_1688 [8];
  ostringstream comment;
  undefined1 local_1510 [8];
  string cmdLine;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_14d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_14c8;
  iterator i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1480;
  string *run_launcher;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1458;
  iterator e;
  iterator i_1;
  string local_1440;
  undefined1 local_1420 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  launcher_cmd;
  char *clauncher;
  string clauncher_prop;
  string local_13d8;
  string local_13b8;
  allocator local_1391;
  string local_1390;
  string local_1370;
  allocator local_1349;
  string local_1348;
  string local_1328;
  undefined1 local_1308 [8];
  string run_iwyu;
  char *cpplint;
  string cpplint_prop;
  char *tidy;
  string tidy_prop;
  char *iwyu;
  string iwyu_prop;
  undefined1 local_1268 [8];
  string compileCmd_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1220;
  undefined1 local_1200 [8];
  string cmdVar_1;
  undefined1 local_11d8 [8];
  string compileCmd;
  string local_11b0 [39];
  allocator local_1189;
  string local_1188 [39];
  allocator local_1161;
  string local_1160;
  allocator local_1139;
  string local_1138 [39];
  allocator local_1111;
  string local_1110;
  undefined1 local_10f0 [8];
  string cmdVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string local_10b0;
  allocator local_1089;
  string local_1088;
  allocator local_1061;
  string local_1060;
  string local_1040;
  string local_1020;
  string local_1000;
  undefined1 local_fe0 [8];
  ostringstream ddDesc;
  undefined1 local_e68 [8];
  ostringstream ddComment;
  undefined1 local_cf0 [8];
  string ddCmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  undefined1 local_c50 [8];
  string cmake_1;
  string ddInput;
  undefined1 local_c08 [8];
  string ddRspContent;
  undefined1 local_be0 [8];
  string ddRspFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ddCmds;
  string local_ba0;
  allocator local_b79;
  string local_b78;
  allocator local_b51;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  undefined1 local_ad0 [8];
  ostringstream ppDesc;
  undefined1 local_958 [8];
  ostringstream ppComment;
  undefined1 local_7e0 [8];
  string ppCmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  undefined1 local_740 [8];
  string cmake;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_700;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6f8;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  RuleVariables ppVars;
  undefined1 local_5e8 [8];
  string ppDepfile;
  string ppDeptype;
  undefined1 local_5a0 [8];
  string ppCmd;
  undefined1 local_560 [8];
  string ppVar;
  string local_538;
  char *local_518;
  char *val;
  string launcher;
  string local_4d0;
  undefined1 local_4b0 [8];
  string tdi;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  allocator local_461;
  string local_460;
  allocator local_439;
  undefined1 local_438 [8];
  string depfileFlags;
  string flagsName;
  char *langdeptype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  allocator local_389;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator local_2e4;
  byte local_2e3;
  byte local_2e2;
  allocator local_2e1;
  string local_2e0;
  byte local_2bb;
  byte local_2ba;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  undefined1 local_270 [8];
  string cl;
  string local_230 [8];
  string cldeps;
  string depfile;
  string deptype;
  string local_1a8 [7];
  bool lang_supports_response;
  string responseFlag;
  string rspcontent;
  string rspfile;
  allocator local_131;
  string local_130 [8];
  string flags;
  cmMakefile *mf;
  undefined1 auStack_100 [6];
  bool needDyndep;
  bool explicitPP;
  RuleVariables vars;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  vars.FilterPrefix = (char *)lang;
  cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)auStack_100);
  pcVar7 = GetGeneratorTarget(this);
  cmGeneratorTarget::GetName_abi_cxx11_(pcVar7);
  _auStack_100 = (pointer)std::__cxx11::string::c_str();
  pcVar7 = GetGeneratorTarget(this);
  targetType = cmGeneratorTarget::GetType(pcVar7);
  vars.CMTargetName = cmState::GetTargetTypeName(targetType);
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.LinkLibraries = "$in";
  vars.Output = "$out";
  vars.LanguageCompileFlags = "$DEFINES";
  vars.Defines = "$INCLUDES";
  vars.CMTargetType = "$TARGET_PDB";
  vars.TargetPDB = "$TARGET_COMPILE_PDB";
  vars.Object = "$OBJECT_DIR";
  vars.ObjectDir = "$OBJECT_FILE_DIR";
  bVar3 = NeedExplicitPreprocessing(this,(string *)vars.FilterPrefix);
  bVar4 = NeedDyndep(this,(string *)vars.FilterPrefix);
  flags.field_2._8_8_ = GetMakefile(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"$FLAGS",&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(responseFlag.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1a8);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vars.FilterPrefix,"RC");
  local_189a = true;
  if (!bVar5) {
    local_189a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)vars.FilterPrefix,"CUDA");
  }
  if ((((local_189a ^ 0xffU) & 1) != 0) && (bVar5 = ForceResponseFile(this), bVar5)) {
    std::__cxx11::string::operator=((string *)(rspcontent.field_2._M_local_buf + 8),"$RSP_FILE");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&deptype.field_2 + 8),"@",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&rspcontent.field_2 + 8));
    std::__cxx11::string::operator=(local_1a8,(string *)(deptype.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(deptype.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)(responseFlag.field_2._M_local_buf + 8)," $DEFINES $INCLUDES $FLAGS");
    std::__cxx11::string::operator=(local_130,local_1a8);
    vars.LanguageCompileFlags = "";
    vars.Defines = "";
  }
  std::__cxx11::string::string((string *)(depfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cldeps.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_230);
  if (!bVar3) {
    bVar5 = NeedDepTypeMSVC(this,(string *)vars.FilterPrefix);
    uVar2 = flags.field_2._8_8_;
    if (bVar5) {
      std::__cxx11::string::operator=((string *)(depfile.field_2._M_local_buf + 8),"msvc");
      std::__cxx11::string::operator=((string *)(cldeps.field_2._M_local_buf + 8),"");
      std::__cxx11::string::operator+=(local_130," /showIncludes");
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&cl.field_2 + 8),"CMAKE_NINJA_CMCLDEPS_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vars.FilterPrefix);
      bVar5 = cmMakefile::IsOn((cmMakefile *)uVar2,(string *)((long)&cl.field_2 + 8));
      std::__cxx11::string::~string((string *)(cl.field_2._M_local_buf + 8));
      if (bVar5) {
        bVar5 = cmMakefile::GetIsSourceFileTryCompile((cmMakefile *)flags.field_2._8_8_);
        if (!bVar5) {
          std::__cxx11::string::operator=((string *)(depfile.field_2._M_local_buf + 8),"gcc");
          std::__cxx11::string::operator=((string *)(cldeps.field_2._M_local_buf + 8),"$DEP_FILE");
          uVar2 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          local_2ba = 0;
          local_2bb = 0;
          local_2e2 = 0;
          local_2e3 = 0;
          std::__cxx11::string::string((string *)&local_290,"CMAKE_C_COMPILER",&local_291);
          pcVar10 = cmMakefile::GetDefinition((cmMakefile *)uVar2,&local_290);
          uVar2 = flags.field_2._8_8_;
          if (pcVar10 == (char *)0x0) {
            std::allocator<char>::allocator();
            local_2e2 = 1;
            std::__cxx11::string::string((string *)&local_2e0,"CMAKE_CXX_COMPILER",&local_2e1);
            local_2e3 = 1;
            local_18f8 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_2e0);
          }
          else {
            std::allocator<char>::allocator();
            local_2ba = 1;
            std::__cxx11::string::string((string *)&local_2b8,"CMAKE_C_COMPILER",&local_2b9);
            local_2bb = 1;
            local_18f8 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_2b8);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_270,local_18f8,&local_2e4);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e4);
          if ((local_2e3 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2e0);
          }
          if ((local_2e2 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
          }
          if ((local_2bb & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2b8);
          }
          if ((local_2ba & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          }
          std::__cxx11::string::~string((string *)&local_290);
          std::allocator<char>::~allocator((allocator<char> *)&local_291);
          std::__cxx11::string::operator=(local_230,"\"");
          psVar11 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
          std::__cxx11::string::operator+=(local_230,(string *)psVar11);
          std::operator+(&local_368,"\" ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         vars.FilterPrefix);
          std::operator+(&local_348,&local_368," ");
          std::operator+(&local_328,&local_348,vars.LinkLibraries);
          std::operator+(&local_308,&local_328," \"$DEP_FILE\" $out \"");
          std::__cxx11::string::operator+=(local_230,(string *)&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_368);
          uVar2 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_388,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_389);
          pcVar10 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_388);
          std::__cxx11::string::operator+=(local_230,pcVar10);
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator((allocator<char> *)&local_389);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &langdeptype,"\" \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270);
          std::operator+(&local_3b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &langdeptype,"\" ");
          std::__cxx11::string::operator+=(local_230,(string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&langdeptype);
          std::__cxx11::string::~string((string *)local_270);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)(depfile.field_2._M_local_buf + 8),"gcc");
        uVar2 = flags.field_2._8_8_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&flagsName.field_2 + 8),"CMAKE_NINJA_DEPTYPE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vars.FilterPrefix);
        pcVar10 = cmMakefile::GetDefinition
                            ((cmMakefile *)uVar2,(string *)((long)&flagsName.field_2 + 8));
        std::__cxx11::string::~string((string *)(flagsName.field_2._M_local_buf + 8));
        if (pcVar10 != (char *)0x0) {
          std::__cxx11::string::operator=((string *)(depfile.field_2._M_local_buf + 8),pcVar10);
        }
        std::__cxx11::string::operator=((string *)(cldeps.field_2._M_local_buf + 8),"$DEP_FILE");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&depfileFlags.field_2 + 8),"CMAKE_DEPFILE_FLAGS_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vars.FilterPrefix);
        pcVar10 = cmMakefile::GetSafeDefinition
                            ((cmMakefile *)flags.field_2._8_8_,
                             (string *)((long)&depfileFlags.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_438,pcVar10,&local_439);
        std::allocator<char>::~allocator((allocator<char> *)&local_439);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          cmsys::SystemTools::ReplaceString((string *)local_438,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString((string *)local_438,"<OBJECT>","$out");
          uVar2 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_460,"CMAKE_C_COMPILER",&local_461);
          pcVar10 = cmMakefile::GetDefinition((cmMakefile *)uVar2,&local_460);
          cmsys::SystemTools::ReplaceString((string *)local_438,"<CMAKE_C_COMPILER>",pcVar10);
          std::__cxx11::string::~string((string *)&local_460);
          std::allocator<char>::~allocator((allocator<char> *)&local_461);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rulePlaceholderExpander," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_438);
          std::__cxx11::string::operator+=(local_130,(string *)&rulePlaceholderExpander);
          std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
        }
        std::__cxx11::string::~string((string *)local_438);
        std::__cxx11::string::~string((string *)(depfileFlags.field_2._M_local_buf + 8));
      }
    }
  }
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  vars.Includes = (char *)std::__cxx11::string::c_str();
  pcVar9 = GetLocalGenerator(this);
  iVar6 = (*(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    ();
  ::cm::auto_ptr<cmRulePlaceholderExpander>::auto_ptr
            ((auto_ptr<cmRulePlaceholderExpander> *)((long)&tdi.field_2 + 8),
             (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar6));
  pcVar9 = GetLocalGenerator(this);
  GetTargetDependInfoPath((string *)((long)&launcher.field_2 + 8),this,(string *)vars.FilterPrefix);
  ConvertToNinjaPath(&local_4d0,this,(string *)((long)&launcher.field_2 + 8));
  cmOutputConverter::ConvertToOutputFormat
            ((string *)local_4b0,
             &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_4d0,SHELL);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&val);
  pcVar9 = GetLocalGenerator(this);
  pcVar7 = GetGeneratorTarget(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_538,"RULE_LAUNCH_COMPILE",
             (allocator *)(ppVar.field_2._M_local_buf + 0xf));
  pcVar10 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar9,pcVar7,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)(ppVar.field_2._M_local_buf + 0xf));
  local_518 = pcVar10;
  if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
    std::__cxx11::string::operator=((string *)&val,pcVar10);
    std::__cxx11::string::operator+=((string *)&val," ");
  }
  if (bVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ppCmd.field_2 + 8),"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.FilterPrefix);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ppCmd.field_2 + 8),"_PREPROCESS_SOURCE");
    std::__cxx11::string::~string((string *)(ppCmd.field_2._M_local_buf + 8));
    this_00 = GetMakefile(this);
    pcVar10 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_560);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_5a0,pcVar10,(allocator *)(ppDeptype.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ppDeptype.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)(ppDepfile.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_5e8,"$DEP_FILE",(allocator *)((long)&ppVars.FilterPrefix + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&ppVars.FilterPrefix + 7));
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)
               &ppCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = _auStack_100;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.TargetVersionMinor = vars.TargetVersionMinor;
    ppVars.Output = "$out";
    ppVars.AssemblySource = "$out";
    ppVars.Includes = (char *)std::__cxx11::string::c_str();
    ppVars.LinkLibraries = vars.LinkLibraries;
    vars.LinkLibraries = "$in";
    ppVars.ObjectFileDir = vars.ObjectFileDir;
    ppVars.LanguageCompileFlags = vars.LanguageCompileFlags;
    vars.LanguageCompileFlags = "";
    ppVars.Defines = vars.Defines;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    cmSystemTools::ExpandListArgument
              ((string *)local_5a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,false);
    local_6f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      local_700._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
      bVar3 = __gnu_cxx::operator!=(&local_6f8,&local_700);
      if (!bVar3) break;
      pbVar15 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_6f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&cmake.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     pbVar15);
      pbVar15 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_6f8);
      std::__cxx11::string::operator=((string *)pbVar15,(string *)(cmake.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(cmake.field_2._M_local_buf + 8));
      pcVar16 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->
                          ((auto_ptr<cmRulePlaceholderExpander> *)((long)&tdi.field_2 + 8));
      pcVar9 = GetLocalGenerator(this);
      local_1a00 = (cmOutputConverter *)0x0;
      if (pcVar9 != (cmLocalNinjaGenerator *)0x0) {
        local_1a00 = &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter;
      }
      pbVar15 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_6f8);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (pcVar16,local_1a00,pbVar15,
                 (RuleVariables *)
                 &ppCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_6f8);
    }
    pcVar9 = GetLocalGenerator(this);
    psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_740,
               &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar11,SHELL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ppCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   " -E cmake_ninja_depends --tdi=");
    std::operator+(&local_7a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ppCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0);
    std::operator+(&local_780,&local_7a0," --pp=$out --dep=$DEP_FILE");
    pcVar10 = "";
    if (bVar4) {
      pcVar10 = " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
    }
    std::operator+(&local_760,&local_780,pcVar10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::~string((string *)(ppCmdLine.field_2._M_local_buf + 8));
    pcVar9 = GetLocalGenerator(this);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_7e0,pcVar9,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_958);
    poVar12 = std::operator<<((ostream *)local_958,"Rule for preprocessing ");
    poVar12 = std::operator<<(poVar12,(string *)vars.FilterPrefix);
    std::operator<<(poVar12," files.");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ad0);
    poVar12 = std::operator<<((ostream *)local_ad0,"Building ");
    poVar12 = std::operator<<(poVar12,(string *)vars.FilterPrefix);
    std::operator<<(poVar12," preprocessed $out");
    pcVar13 = GetGlobalGenerator(this);
    LanguagePreprocessRule(&local_af0,this,(string *)vars.FilterPrefix);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b50,"",&local_b51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b78,"",&local_b79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_ba0,"",
               (allocator *)
               ((long)&ddCmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmGlobalNinjaGenerator::AddRule
              (pcVar13,&local_af0,(string *)local_7e0,&local_b10,&local_b30,(string *)local_5e8,
               (string *)((long)&ppDepfile.field_2 + 8),&local_b50,&local_b78,&local_ba0,false);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ddCmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_b78);
    std::allocator<char>::~allocator((allocator<char> *)&local_b79);
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator((allocator<char> *)&local_b51);
    std::__cxx11::string::~string((string *)&local_b30);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::~string((string *)&local_af0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ad0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_958);
    std::__cxx11::string::~string((string *)local_7e0);
    std::__cxx11::string::~string((string *)local_740);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    std::__cxx11::string::~string((string *)local_5e8);
    std::__cxx11::string::~string((string *)(ppDepfile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_5a0);
    std::__cxx11::string::~string((string *)local_560);
  }
  if (bVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&ddRspFile.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_be0,"$out.rsp",(allocator *)(ddRspContent.field_2._M_local_buf + 0xf)
              );
    std::allocator<char>::~allocator((allocator<char> *)(ddRspContent.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c08,"$in",(allocator *)(ddInput.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ddInput.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmake_1.field_2 + 8),"@",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be0);
    pcVar9 = GetLocalGenerator(this);
    psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_c50,
               &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar11,SHELL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ddCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c50,
                   " -E cmake_ninja_dyndep --tdi=");
    std::operator+(&local_cb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ddCmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0);
    std::operator+(&local_c90,&local_cb0," --dd=$out ");
    std::operator+(&local_c70,&local_c90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmake_1.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&ddRspFile.field_2 + 8),&local_c70);
    std::__cxx11::string::~string((string *)&local_c70);
    std::__cxx11::string::~string((string *)&local_c90);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::__cxx11::string::~string((string *)(ddCmdLine.field_2._M_local_buf + 8));
    pcVar9 = GetLocalGenerator(this);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_cf0,pcVar9,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&ddRspFile.field_2 + 8));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e68);
    poVar12 = std::operator<<((ostream *)local_e68,"Rule to generate ninja dyndep files for ");
    poVar12 = std::operator<<(poVar12,(string *)vars.FilterPrefix);
    std::operator<<(poVar12,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fe0);
    poVar12 = std::operator<<((ostream *)local_fe0,"Generating ");
    poVar12 = std::operator<<(poVar12,(string *)vars.FilterPrefix);
    std::operator<<(poVar12," dyndep file $out");
    pcVar13 = GetGlobalGenerator(this);
    LanguageDyndepRule(&local_1000,this,(string *)vars.FilterPrefix);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1060,"",&local_1061);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1088,"",&local_1089);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_10b0,"",
               (allocator *)
               ((long)&compileCmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmGlobalNinjaGenerator::AddRule
              (pcVar13,&local_1000,(string *)local_cf0,&local_1020,&local_1040,&local_1060,
               &local_1088,(string *)local_be0,(string *)local_c08,&local_10b0,false);
    std::__cxx11::string::~string((string *)&local_10b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&compileCmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_1088);
    std::allocator<char>::~allocator((allocator<char> *)&local_1089);
    std::__cxx11::string::~string((string *)&local_1060);
    std::allocator<char>::~allocator((allocator<char> *)&local_1061);
    std::__cxx11::string::~string((string *)&local_1040);
    std::__cxx11::string::~string((string *)&local_1020);
    std::__cxx11::string::~string((string *)&local_1000);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fe0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e68);
    std::__cxx11::string::~string((string *)local_cf0);
    std::__cxx11::string::~string((string *)local_c50);
    std::__cxx11::string::~string((string *)(cmake_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_c08);
    std::__cxx11::string::~string((string *)local_be0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&ddRspFile.field_2 + 8));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&cmdVar.field_2 + 8));
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vars.FilterPrefix,"CUDA");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_10f0);
    pcVar7 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1110,"CUDA_SEPARABLE_COMPILATION",&local_1111);
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar7,&local_1110);
    std::__cxx11::string::~string((string *)&local_1110);
    std::allocator<char>::~allocator((allocator<char> *)&local_1111);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1138,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION",&local_1139);
      std::__cxx11::string::operator=((string *)local_10f0,local_1138);
      std::__cxx11::string::~string(local_1138);
      std::allocator<char>::~allocator((allocator<char> *)&local_1139);
    }
    else {
      pcVar7 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1160,"CUDA_PTX_COMPILATION",&local_1161);
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar7,&local_1160);
      std::__cxx11::string::~string((string *)&local_1160);
      std::allocator<char>::~allocator((allocator<char> *)&local_1161);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1188,"CMAKE_CUDA_COMPILE_PTX_COMPILATION",&local_1189);
        std::__cxx11::string::operator=((string *)local_10f0,local_1188);
        std::__cxx11::string::~string(local_1188);
        std::allocator<char>::~allocator((allocator<char> *)&local_1189);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_11b0,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION",
                   (allocator *)(compileCmd.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator=((string *)local_10f0,local_11b0);
        std::__cxx11::string::~string(local_11b0);
        std::allocator<char>::~allocator((allocator<char> *)(compileCmd.field_2._M_local_buf + 0xf))
        ;
      }
    }
    pcVar10 = cmMakefile::GetRequiredDefinition
                        ((cmMakefile *)flags.field_2._8_8_,(string *)local_10f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_11d8,pcVar10,(allocator *)(cmdVar_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(cmdVar_1.field_2._M_local_buf + 0xf));
    cmSystemTools::ExpandListArgument
              ((string *)local_11d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8),false);
    std::__cxx11::string::~string((string *)local_11d8);
    std::__cxx11::string::~string((string *)local_10f0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1240,"CMAKE_",(allocator *)(compileCmd_1.field_2._M_local_buf + 0xf)
              );
    std::operator+(&local_1220,&local_1240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.FilterPrefix);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1200,
                   &local_1220,"_COMPILE_OBJECT");
    std::__cxx11::string::~string((string *)&local_1220);
    std::__cxx11::string::~string((string *)&local_1240);
    std::allocator<char>::~allocator((allocator<char> *)(compileCmd_1.field_2._M_local_buf + 0xf));
    pcVar10 = cmMakefile::GetRequiredDefinition
                        ((cmMakefile *)flags.field_2._8_8_,(string *)local_1200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_1268,pcVar10,(allocator *)(iwyu_prop.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(iwyu_prop.field_2._M_local_buf + 0xf));
    cmSystemTools::ExpandListArgument
              ((string *)local_1268,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8),false);
    std::__cxx11::string::~string((string *)local_1268);
    std::__cxx11::string::~string((string *)local_1200);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if ((!bVar3) &&
     ((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.FilterPrefix,"C"), bVar3 ||
      (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.FilterPrefix,"CXX"), bVar3)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iwyu,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.FilterPrefix,"_INCLUDE_WHAT_YOU_USE");
    tidy_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&iwyu);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tidy,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.FilterPrefix,"_CLANG_TIDY");
    cpplint_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&tidy);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpplint,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.FilterPrefix,"_CPPLINT");
    run_iwyu.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&cpplint);
    if (((tidy_prop.field_2._8_8_ != 0) && (*(char *)tidy_prop.field_2._8_8_ != '\0')) ||
       (((cpplint_prop.field_2._8_8_ != 0 && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) ||
        (((char *)run_iwyu.field_2._8_8_ != (char *)0x0 && (*(char *)run_iwyu.field_2._8_8_ != '\0')
         ))))) {
      pcVar9 = GetLocalGenerator(this);
      psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)local_1308,
                 &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar11,SHELL);
      std::__cxx11::string::operator+=((string *)local_1308," -E __run_iwyu");
      if ((tidy_prop.field_2._8_8_ != 0) && (*(char *)tidy_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=((string *)local_1308," --iwyu=");
        pcVar9 = GetLocalGenerator(this);
        uVar2 = tidy_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1348,(char *)uVar2,&local_1349);
        cmOutputConverter::EscapeForShell
                  (&local_1328,
                   &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_1348,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1308,(string *)&local_1328);
        std::__cxx11::string::~string((string *)&local_1328);
        std::__cxx11::string::~string((string *)&local_1348);
        std::allocator<char>::~allocator((allocator<char> *)&local_1349);
      }
      if ((cpplint_prop.field_2._8_8_ != 0) && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=((string *)local_1308," --tidy=");
        pcVar9 = GetLocalGenerator(this);
        uVar2 = cpplint_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1390,(char *)uVar2,&local_1391);
        cmOutputConverter::EscapeForShell
                  (&local_1370,
                   &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_1390,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1308,(string *)&local_1370);
        std::__cxx11::string::~string((string *)&local_1370);
        std::__cxx11::string::~string((string *)&local_1390);
        std::allocator<char>::~allocator((allocator<char> *)&local_1391);
      }
      if ((run_iwyu.field_2._8_8_ != 0) && (*(char *)run_iwyu.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=((string *)local_1308," --cpplint=");
        pcVar9 = GetLocalGenerator(this);
        uVar2 = run_iwyu.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_13d8,(char *)uVar2,
                   (allocator *)(clauncher_prop.field_2._M_local_buf + 0xf));
        cmOutputConverter::EscapeForShell
                  (&local_13b8,
                   &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_13d8,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1308,(string *)&local_13b8);
        std::__cxx11::string::~string((string *)&local_13b8);
        std::__cxx11::string::~string((string *)&local_13d8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(clauncher_prop.field_2._M_local_buf + 0xf));
      }
      if (((cpplint_prop.field_2._8_8_ != 0) && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) ||
         ((run_iwyu.field_2._8_8_ != 0 && (*(char *)run_iwyu.field_2._8_8_ != '\0')))) {
        std::__cxx11::string::operator+=((string *)local_1308," --source=$in");
      }
      std::__cxx11::string::operator+=((string *)local_1308," -- ");
      pvVar14 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&cmdVar.field_2 + 8));
      std::__cxx11::string::insert((ulong)pvVar14,(string *)0x0);
      std::__cxx11::string::~string((string *)local_1308);
    }
    std::__cxx11::string::~string((string *)&cpplint);
    std::__cxx11::string::~string((string *)&tidy);
    std::__cxx11::string::~string((string *)&iwyu);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if ((!bVar3) &&
     (((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vars.FilterPrefix,"C"), bVar3 ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vars.FilterPrefix,"CXX"), bVar3)) ||
      (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.FilterPrefix,"CUDA"), bVar3)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&clauncher,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.FilterPrefix,"_COMPILER_LAUNCHER");
    launcher_cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmGeneratorTarget::GetProperty
                            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                             (string *)&clauncher);
    if ((launcher_cmd.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
       ((launcher_cmd.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus != (_Alloc_hider)0x0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1420);
      pbVar1 = launcher_cmd.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1440,(char *)pbVar1,(allocator *)((long)&i_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_1440,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1420,true);
      std::__cxx11::string::~string((string *)&local_1440);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
      e = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1420);
      local_1458._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1420);
      while (bVar3 = __gnu_cxx::operator!=(&e,&local_1458), bVar3) {
        pcVar9 = this->LocalGenerator;
        pbVar15 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&e);
        cmOutputConverter::EscapeForShell
                  ((string *)&run_launcher,
                   &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,pbVar15,false,false,false);
        pbVar15 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&e);
        std::__cxx11::string::operator=((string *)pbVar15,(string *)&run_launcher);
        std::__cxx11::string::~string((string *)&run_launcher);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&e);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)&i_2,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1420," ");
      std::operator+(&local_14a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2," ");
      std::__cxx11::string::~string((string *)&i_2);
      local_1480 = &local_14a0;
      pvVar14 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&cmdVar.field_2 + 8));
      std::__cxx11::string::insert((ulong)pvVar14,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_14a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1420);
    }
    std::__cxx11::string::~string((string *)&clauncher);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if (!bVar3) {
    pvVar14 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&cmdVar.field_2 + 8));
    std::__cxx11::string::insert((ulong)pvVar14,(string *)0x0);
  }
  local_14c8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8));
  while( true ) {
    local_14d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8));
    bVar3 = __gnu_cxx::operator!=(&local_14c8,&local_14d0);
    if (!bVar3) break;
    pbVar15 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_14c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmdLine.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,pbVar15
                  );
    pbVar15 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_14c8);
    std::__cxx11::string::operator=((string *)pbVar15,(string *)(cmdLine.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cmdLine.field_2._M_local_buf + 8));
    pcVar16 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->
                        ((auto_ptr<cmRulePlaceholderExpander> *)((long)&tdi.field_2 + 8));
    pcVar9 = GetLocalGenerator(this);
    local_1c30 = (cmOutputConverter *)0x0;
    if (pcVar9 != (cmLocalNinjaGenerator *)0x0) {
      local_1c30 = &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter;
    }
    pbVar15 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_14c8);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar16,local_1c30,pbVar15,(RuleVariables *)auStack_100);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_14c8);
  }
  pcVar9 = GetLocalGenerator(this);
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_1510,pcVar9,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&cmdVar.field_2 + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1688);
  poVar12 = std::operator<<((ostream *)local_1688,"Rule for compiling ");
  poVar12 = std::operator<<(poVar12,(string *)vars.FilterPrefix);
  std::operator<<(poVar12," files.");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1800);
  poVar12 = std::operator<<((ostream *)local_1800,"Building ");
  poVar12 = std::operator<<(poVar12,(string *)vars.FilterPrefix);
  std::operator<<(poVar12," object $out");
  pcVar13 = GetGlobalGenerator(this);
  LanguageCompilerRule(&local_1820,this,(string *)vars.FilterPrefix);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1880,"",&local_1881);
  cmGlobalNinjaGenerator::AddRule
            (pcVar13,&local_1820,(string *)local_1510,&local_1840,&local_1860,
             (string *)((long)&cldeps.field_2 + 8),(string *)((long)&depfile.field_2 + 8),
             (string *)((long)&rspcontent.field_2 + 8),(string *)((long)&responseFlag.field_2 + 8),
             &local_1880,false);
  std::__cxx11::string::~string((string *)&local_1880);
  std::allocator<char>::~allocator((allocator<char> *)&local_1881);
  std::__cxx11::string::~string((string *)&local_1860);
  std::__cxx11::string::~string((string *)&local_1840);
  std::__cxx11::string::~string((string *)&local_1820);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1800);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1688);
  std::__cxx11::string::~string((string *)local_1510);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&cmdVar.field_2 + 8));
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)local_4b0);
  ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr
            ((auto_ptr<cmRulePlaceholderExpander> *)((long)&tdi.field_2 + 8));
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)(cldeps.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(depfile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string((string *)(responseFlag.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_130);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";
  std::string rspfile;
  std::string rspcontent;
  std::string responseFlag;

  bool const lang_supports_response = !(lang == "RC" || lang == "CUDA");
  if (lang_supports_response && this->ForceResponseFile()) {
    rspfile = "$RSP_FILE";
    responseFlag = "@" + rspfile;
    rspcontent = " $DEFINES $INCLUDES $FLAGS";
    flags = responseFlag;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string deptype;
  std::string depfile;
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    deptype = "msvc";
    depfile = "";
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      deptype = "gcc";
      depfile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " \"$DEP_FILE\" $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    deptype = "gcc";
    const char* langdeptype = mf->GetDefinition("CMAKE_NINJA_DEPTYPE_" + lang);
    if (langdeptype) {
      deptype = langdeptype;
    }
    depfile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = depfile.c_str();

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  if (explicitPP) {
    // Lookup the explicit preprocessing rule.
    std::string const ppVar = "CMAKE_" + lang + "_PREPROCESS_SOURCE";
    std::string const ppCmd =
      this->GetMakefile()->GetRequiredDefinition(ppVar);

    // Explicit preprocessing always uses a depfile.
    std::string const ppDeptype; // no deps= for multiple outputs
    std::string const ppDepfile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = ppDepfile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    ppVars.Flags = vars.Flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    cmSystemTools::ExpandListArgument(ppCmd, ppCmds);

    for (std::vector<std::string>::iterator i = ppCmds.begin();
         i != ppCmds.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   *i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ppCmds.push_back(
      cmake + " -E cmake_ninja_depends"
              " --tdi=" +
      tdi + " --pp=$out"
            " --dep=$DEP_FILE" +
      (needDyndep ? " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE" : ""));

    std::string const ppCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    std::ostringstream ppComment;
    ppComment << "Rule for preprocessing " << lang << " files.";
    std::ostringstream ppDesc;
    ppDesc << "Building " << lang << " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(this->LanguagePreprocessRule(lang),
                                        ppCmdLine, ppDesc.str(),
                                        ppComment.str(), ppDepfile, ppDeptype,
                                        /*rspfile*/ "",
                                        /*rspcontent*/ "",
                                        /*restat*/ "",
                                        /*generator*/ false);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    std::vector<std::string> ddCmds;

    // Command line length is almost always limited -> use response file for
    // dyndep rules
    std::string ddRspFile = "$out.rsp";
    std::string ddRspContent = "$in";
    std::string ddInput = "@" + ddRspFile;

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ddCmds.push_back(cmake + " -E cmake_ninja_dyndep"
                             " --tdi=" +
                     tdi + " --dd=$out"
                           " " +
                     ddInput);

    std::string const ddCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ddCmds);

    std::ostringstream ddComment;
    ddComment << "Rule to generate ninja dyndep files for " << lang << ".";
    std::ostringstream ddDesc;
    ddDesc << "Generating " << lang << " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguageDyndepRule(lang), ddCmdLine, ddDesc.str(), ddComment.str(),
      /*depfile*/ "",
      /*deps*/ "", ddRspFile, ddRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_PTX_COMPILATION");
    } else {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
    }
    std::string compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar =
      std::string("CMAKE_") + lang + "_COMPILE_OBJECT";
    std::string compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint)) {
      std::string run_iwyu = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
      run_iwyu += " -E __run_iwyu";
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // Maybe insert a compiler launcher like ccache or distcc
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      std::vector<std::string> launcher_cmd;
      cmSystemTools::ExpandListArgument(clauncher, launcher_cmd, true);
      for (std::vector<std::string>::iterator i = launcher_cmd.begin(),
                                              e = launcher_cmd.end();
           i != e; ++i) {
        *i = this->LocalGenerator->EscapeForShell(*i);
      }
      std::string const& run_launcher = cmJoin(launcher_cmd, " ") + " ";
      compileCmds.front().insert(0, run_launcher);
    }
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::vector<std::string>::iterator i = compileCmds.begin();
       i != compileCmds.end(); ++i) {
    *i = launcher + *i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), *i,
                                                 vars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  std::ostringstream comment;
  comment << "Rule for compiling " << lang << " files.";
  std::ostringstream description;
  description << "Building " << lang << " object $out";
  this->GetGlobalGenerator()->AddRule(
    this->LanguageCompilerRule(lang), cmdLine, description.str(),
    comment.str(), depfile, deptype, rspfile, rspcontent,
    /*restat*/ "",
    /*generator*/ false);
}